

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_godunov_ppm.cpp
# Opt level: O2

void PPM::PredictVelOnFaces
               (Box *bx,Array4<double> *Imx,Array4<double> *Imy,Array4<double> *Imz,
               Array4<double> *Ipx,Array4<double> *Ipy,Array4<double> *Ipz,Array4<const_double> *q,
               Array4<const_double> *vel,Geometry geom,Real dt,BCRec *pbc)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  double *pdVar27;
  long lVar28;
  double *pdVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  ulong uVar43;
  long lVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  int iVar53;
  long lVar54;
  long lVar55;
  BCRec *pBVar56;
  long lVar57;
  int iVar58;
  long lVar59;
  int iVar60;
  double *pdVar61;
  long lVar62;
  long lVar63;
  double *pdVar64;
  int iVar65;
  long lVar66;
  int iVar67;
  long lVar68;
  double *pdVar69;
  long lVar70;
  long lVar71;
  long lVar72;
  long lVar73;
  double *pdVar74;
  long lVar75;
  double *pdVar76;
  long lVar77;
  long lVar78;
  long lVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  undefined4 uVar82;
  undefined4 uVar83;
  undefined4 uVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double *local_4b8;
  double *local_4a8;
  double *local_4a0;
  double *local_498;
  double *local_490;
  double *local_488;
  double *local_480;
  double *local_450;
  double *local_448;
  double *local_440;
  double *local_438;
  double *local_430;
  double *local_428;
  double *local_420;
  double *local_418;
  double *local_410;
  double *local_408;
  double *local_400;
  double *local_3f8;
  double *local_3f0;
  double *local_308;
  double *local_270;
  double *local_268;
  double *local_260;
  double *local_258;
  double *local_250;
  double *local_248;
  double *local_240;
  double *local_238;
  double *local_230;
  double *local_228;
  
  lVar17 = Imx->kstride;
  lVar18 = Ipx->kstride;
  iVar2 = (bx->smallend).vect[0];
  lVar78 = (long)iVar2;
  iVar47 = (bx->smallend).vect[2];
  lVar68 = (long)iVar47;
  lVar19 = Imy->kstride;
  lVar20 = Ipy->kstride;
  lVar21 = Ipz->kstride;
  lVar22 = Imz->kstride;
  uVar3 = (q->begin).x;
  lVar59 = (long)(int)uVar3;
  iVar45 = geom.domain.bigend.vect[0] - uVar3;
  uVar4 = (q->begin).y;
  iVar53 = geom.domain.bigend.vect[1] - uVar4;
  uVar5 = (q->begin).z;
  iVar58 = geom.domain.bigend.vect[2] - uVar5;
  iVar46 = iVar2 - uVar3;
  lVar23 = q->kstride;
  lVar49 = (lVar68 - (int)uVar5) * lVar23;
  lVar24 = q->jstride;
  lVar25 = vel->kstride;
  lVar54 = (lVar68 - (vel->begin).z) * lVar25;
  lVar26 = vel->nstride;
  lVar55 = (long)(vel->begin).x;
  pdVar27 = vel->p;
  lVar28 = vel->jstride;
  iVar6 = (vel->begin).y;
  pdVar29 = q->p;
  lVar30 = q->nstride;
  pdVar61 = Imx->p + (((lVar68 - (Imx->begin).z) * lVar17 + lVar78) - (long)(Imx->begin).x);
  lVar31 = Imx->jstride;
  lVar32 = Imx->nstride;
  iVar7 = (Imx->begin).y;
  pdVar64 = Ipx->p + (((lVar68 - (Ipx->begin).z) * lVar18 + lVar78) - (long)(Ipx->begin).x);
  pdVar69 = Imy->p + (((lVar68 - (Imy->begin).z) * lVar19 + lVar78) - (long)(Imy->begin).x);
  lVar33 = Ipx->jstride;
  lVar34 = Ipx->nstride;
  iVar8 = (Ipx->begin).y;
  lVar35 = Imy->jstride;
  lVar36 = Imy->nstride;
  iVar9 = (Imy->begin).y;
  pdVar76 = Ipy->p + (((lVar68 - (Ipy->begin).z) * lVar20 + lVar78) - (long)(Ipy->begin).x);
  lVar37 = Ipy->jstride;
  lVar38 = Ipy->nstride;
  iVar10 = (Ipy->begin).y;
  local_4b8 = Imz->p + (((lVar68 - (Imz->begin).z) * lVar22 + lVar78) - (long)(Imz->begin).x);
  lVar39 = Imz->jstride;
  lVar40 = Imz->nstride;
  iVar11 = (Imz->begin).y;
  pdVar74 = Ipz->p + (((lVar68 - (Ipz->begin).z) * lVar21 + lVar78) - (long)(Ipz->begin).x);
  lVar41 = Ipz->jstride;
  lVar42 = Ipz->nstride;
  iVar12 = (Ipz->begin).y;
  iVar13 = (bx->smallend).vect[1];
  iVar14 = (bx->bigend).vect[0];
  iVar15 = (bx->bigend).vect[1];
  iVar16 = (bx->bigend).vect[2];
  local_480 = pdVar29 + (((int)((geom.domain.smallend.vect[1] - uVar4) + 2) * lVar24 +
                         lVar49 + lVar78) - lVar59);
  local_488 = pdVar29 + (((int)(geom.domain.smallend.vect[1] - uVar4) * lVar24 + lVar49 + lVar78) -
                        lVar59);
  local_490 = pdVar29 + (((int)(~uVar4 + geom.domain.smallend.vect[1]) * lVar24 + lVar49 + lVar78) -
                        lVar59);
  local_498 = pdVar29 + (((iVar53 + -2) * lVar24 + lVar49 + lVar78) - lVar59);
  local_4a0 = pdVar29 + ((iVar53 * lVar24 + lVar49 + lVar78) - lVar59);
  local_4a8 = pdVar29 + (((iVar53 + 1) * lVar24 + lVar49 + lVar78) - lVar59);
  local_308 = pdVar29 + ((lVar49 + lVar78) - lVar59);
  local_420 = pdVar29 + (((int)((geom.domain.smallend.vect[2] - uVar5) + 2) * lVar23 + lVar78) -
                        lVar59);
  local_428 = pdVar29 + (((int)(geom.domain.smallend.vect[2] - uVar5) * lVar23 + lVar78) - lVar59);
  local_430 = pdVar29 + (((int)(~uVar5 + geom.domain.smallend.vect[2]) * lVar23 + lVar78) - lVar59);
  local_438 = pdVar29 + (((iVar58 + -2) * lVar23 + lVar78) - lVar59);
  local_440 = pdVar29 + ((iVar58 * lVar23 + lVar78) - lVar59);
  local_448 = pdVar29 + (((iVar58 + 1) * lVar23 + lVar78) - lVar59);
  local_450 = pdVar29 + (lVar78 - lVar59);
  iVar47 = iVar47 - uVar5;
  lVar49 = lVar23 * 8;
  lVar59 = lVar24 * 8;
  lVar57 = 0;
  do {
    if (lVar57 == 3) {
      return;
    }
    pBVar56 = pbc + lVar57;
    lVar50 = lVar57 * lVar30;
    local_270 = local_308;
    local_228 = local_4a8;
    local_230 = local_4a0;
    local_238 = local_498;
    local_240 = local_490;
    local_248 = local_488;
    local_250 = local_480;
    local_3f0 = local_4b8;
    lVar70 = lVar68;
    iVar58 = iVar47 + -1;
    iVar60 = iVar47 + 2;
    local_418 = pdVar61;
    local_410 = pdVar64;
    local_408 = pdVar69;
    local_400 = pdVar76;
    local_3f8 = pdVar74;
    local_268 = pdVar27 + ((lVar54 + lVar78 + lVar26 * 2) - lVar55);
    local_260 = pdVar27 + ((lVar26 + lVar54 + lVar78) - lVar55);
    local_258 = pdVar27 + ((lVar54 + lVar78) - lVar55);
    iVar65 = iVar47 + -2;
    iVar53 = iVar47;
    while (iVar53 = iVar53 + 1, lVar70 <= iVar16) {
      lVar51 = (lVar70 - (int)uVar5) * lVar23;
      lVar44 = (long)iVar13;
      while (lVar62 = lVar44, lVar62 <= iVar15) {
        if (iVar14 < iVar2) {
          lVar44 = lVar62 + 1;
        }
        else {
          lVar66 = (lVar62 - iVar6) * lVar28 * 8;
          lVar52 = (lVar62 - (int)uVar4) * lVar24;
          lVar73 = (lVar62 - iVar8) * lVar33 * 8;
          lVar71 = (lVar62 - iVar7) * lVar31 * 8;
          iVar48 = (int)lVar62 - uVar4;
          lVar77 = (lVar62 - iVar10) * lVar37 * 8;
          lVar75 = (lVar62 - iVar9) * lVar35 * 8;
          lVar63 = (lVar62 - iVar12) * lVar41 * 8;
          lVar79 = (lVar62 - (int)uVar4) * lVar59;
          lVar72 = 0;
          do {
            iVar67 = (int)lVar72;
            dVar90 = pdVar29[lVar52 + lVar51 + lVar50 + (iVar46 + -1 + iVar67)];
            dVar1 = *(double *)((long)local_270 + lVar72 * 8 + lVar79);
            dVar87 = pdVar29[lVar52 + lVar51 + lVar50 + (iVar46 + 1 + iVar67)];
            dVar92 = (dVar87 - dVar1) + (dVar87 - dVar1);
            dVar93 = (dVar1 - dVar90) + (dVar1 - dVar90);
            dVar99 = 0.0;
            dVar86 = ABS(dVar92);
            dVar88 = ABS(dVar93);
            dVar85 = 0.0;
            uVar43 = (ulong)DAT_00601290;
            if (1.0000000000000001e-20 < dVar93 * dVar92) {
              dVar96 = (dVar87 - dVar90) * 0.5;
              dVar89 = ABS(dVar96);
              dVar85 = dVar86;
              if (dVar88 <= dVar86) {
                dVar85 = dVar88;
              }
              if (dVar89 <= dVar85) {
                dVar85 = dVar89;
              }
              dVar85 = dVar85 * (double)((ulong)dVar96 & 0x8000000000000000 | uVar43);
            }
            dVar96 = pdVar29[lVar52 + lVar51 + lVar50 + (iVar46 + -2 + iVar67)];
            dVar89 = (dVar90 - dVar96) + (dVar90 - dVar96);
            if (1.0000000000000001e-20 < dVar89 * dVar93) {
              dVar94 = (dVar1 - dVar96) * 0.5;
              dVar95 = ABS(dVar94);
              dVar89 = ABS(dVar89);
              dVar99 = ABS(dVar93);
              if (dVar89 <= ABS(dVar93)) {
                dVar99 = dVar89;
              }
              if (dVar95 <= dVar99) {
                dVar99 = dVar95;
              }
              dVar99 = dVar99 * (double)((ulong)dVar94 & 0x8000000000000000 | uVar43);
            }
            dVar89 = pdVar29[lVar52 + lVar51 + lVar50 + (iVar46 + iVar67 + 2)];
            dVar94 = (dVar89 - dVar87) + (dVar89 - dVar87);
            dVar95 = 0.0;
            dVar97 = 0.0;
            if (1.0000000000000001e-20 < dVar92 * dVar94) {
              dVar97 = (dVar89 - dVar1) * 0.5;
              dVar98 = ABS(dVar97);
              dVar94 = ABS(dVar94);
              if (ABS(dVar92) <= dVar94) {
                dVar94 = ABS(dVar92);
              }
              if (dVar98 <= dVar94) {
                dVar94 = dVar98;
              }
              dVar97 = dVar94 * (double)((ulong)dVar97 & 0x8000000000000000 | uVar43);
            }
            if (1.0000000000000001e-20 < dVar93 * dVar92) {
              dVar92 = (dVar87 - dVar90) * 0.5;
              dVar93 = ABS(dVar92);
              if (dVar88 <= dVar86) {
                dVar86 = dVar88;
              }
              if (dVar93 <= dVar86) {
                dVar86 = dVar93;
              }
              dVar95 = dVar86 * (double)((ulong)dVar92 & 0x8000000000000000 | uVar43);
            }
            dVar86 = (dVar90 + dVar1) * 0.5 + (dVar85 - dVar99) * -0.16666666666666666;
            dVar85 = dVar90;
            if (dVar1 <= dVar90) {
              dVar85 = dVar1;
            }
            if (dVar85 <= dVar86) {
              dVar85 = dVar86;
            }
            dVar86 = dVar90;
            if (dVar90 <= dVar1) {
              dVar86 = dVar1;
            }
            if (dVar85 <= dVar86) {
              dVar86 = dVar85;
            }
            dVar99 = (dVar1 + dVar87) * 0.5 + (dVar97 - dVar95) * -0.16666666666666666;
            dVar85 = dVar87;
            if (dVar1 <= dVar87) {
              dVar85 = dVar1;
            }
            if (dVar85 <= dVar99) {
              dVar85 = dVar99;
            }
            dVar99 = dVar87;
            if (dVar87 <= dVar1) {
              dVar99 = dVar1;
            }
            if (dVar85 <= dVar99) {
              dVar99 = dVar85;
            }
            dVar92 = dVar99 - dVar1;
            dVar85 = dVar1;
            dVar88 = dVar1;
            if (0.0 <= (dVar1 - dVar86) * dVar92) {
              dVar93 = ABS(dVar92);
              dVar94 = ABS(dVar86 - dVar1);
              dVar88 = dVar86;
              if (dVar94 + dVar94 <= dVar93) {
                dVar85 = dVar1 * 3.0 - (dVar86 + dVar86);
              }
              else {
                dVar85 = dVar99;
                if (dVar93 + dVar93 <= dVar94) {
                  dVar88 = dVar1 * 3.0 - (dVar99 + dVar99);
                }
              }
            }
            dVar93 = *(double *)((long)local_258 + lVar72 * 8 + lVar66);
            if (pBVar56->bc[0] - 3U < 2) {
              if (geom.domain.smallend.vect[0] - lVar78 == lVar72) {
                dVar85 = dVar89 * -0.05 + dVar87 * 0.5 + dVar90 * -0.2 + dVar1 * 0.75;
                dVar99 = dVar1;
                if (dVar87 <= dVar1) {
                  dVar99 = dVar87;
                }
                if (dVar99 <= dVar85) {
                  dVar99 = dVar85;
                }
                dVar85 = dVar1;
                if (dVar1 <= dVar87) {
                  dVar85 = dVar87;
                }
                dVar88 = dVar90;
                if (dVar99 <= dVar85) {
                  dVar85 = dVar99;
                }
              }
              else if ((geom.domain.smallend.vect[0] + 1) - lVar78 == lVar72) {
                dVar86 = pdVar29[lVar52 + lVar51 + (int)(geom.domain.smallend.vect[0] - uVar3) +
                                                   lVar50];
                dVar88 = pdVar29[lVar52 + lVar51 + (int)((geom.domain.smallend.vect[0] - uVar3) + 2)
                                                   + lVar50] * -0.05 +
                         dVar1 * 0.5 +
                         pdVar29[lVar52 + lVar51 + (int)(~uVar3 + geom.domain.smallend.vect[0]) +
                                                   lVar50] * -0.2 + dVar86 * 0.75;
                dVar85 = dVar86;
                if (dVar1 <= dVar86) {
                  dVar85 = dVar1;
                }
                if (dVar85 <= dVar88) {
                  dVar85 = dVar88;
                }
                if (dVar86 <= dVar1) {
                  dVar86 = dVar1;
                }
                if (dVar85 <= dVar86) {
                  dVar86 = dVar85;
                }
                dVar85 = dVar1;
                dVar88 = dVar1;
                if (0.0 < (dVar1 - dVar86) * dVar92) {
                  dVar92 = ABS(dVar92);
                  dVar89 = ABS(dVar86 - dVar1);
                  dVar88 = dVar86;
                  if (dVar89 + dVar89 <= dVar92) {
                    dVar85 = dVar1 * 3.0 - (dVar86 + dVar86);
                  }
                  else {
                    dVar85 = dVar99;
                    if (dVar92 + dVar92 <= dVar89) {
                      dVar88 = dVar1 * 3.0 - (dVar99 + dVar99);
                    }
                  }
                }
              }
            }
            if (pBVar56->bc[3] - 3U < 2) {
              if (geom.domain.bigend.vect[0] - lVar78 == lVar72) {
                dVar85 = dVar96 * -0.05 + dVar90 * 0.5 + dVar87 * -0.2 + dVar1 * 0.75;
                dVar86 = dVar1;
                if (dVar90 <= dVar1) {
                  dVar86 = dVar90;
                }
                if (dVar86 <= dVar85) {
                  dVar86 = dVar85;
                }
                dVar88 = dVar1;
                if (dVar1 <= dVar90) {
                  dVar88 = dVar90;
                }
                dVar85 = dVar87;
                if (dVar86 <= dVar88) {
                  dVar88 = dVar86;
                }
              }
              else if ((geom.domain.bigend.vect[0] + -1) - lVar78 == lVar72) {
                dVar90 = pdVar29[lVar52 + lVar51 + iVar45 + lVar50];
                uVar80 = SUB84(dVar90,0);
                uVar81 = (undefined4)((ulong)dVar90 >> 0x20);
                dVar85 = pdVar29[lVar52 + lVar51 + (iVar45 + -2) + lVar50] * -0.05 +
                         dVar1 * 0.5 +
                         pdVar29[lVar52 + lVar51 + (iVar45 + 1) + lVar50] * -0.2 + dVar90 * 0.75;
                dVar87 = dVar90;
                if (dVar1 <= dVar90) {
                  dVar87 = dVar1;
                }
                if (dVar87 <= dVar85) {
                  dVar87 = dVar85;
                }
                if (dVar90 <= dVar1) {
                  uVar80 = SUB84(dVar1,0);
                  uVar81 = (undefined4)((ulong)dVar1 >> 0x20);
                }
                if (dVar87 <= (double)CONCAT44(uVar81,uVar80)) {
                  uVar80 = SUB84(dVar87,0);
                  uVar81 = (undefined4)((ulong)dVar87 >> 0x20);
                }
                dVar90 = (double)CONCAT44(uVar81,uVar80) - dVar1;
                dVar85 = dVar1;
                dVar88 = dVar1;
                if (0.0 < (dVar1 - dVar86) * dVar90) {
                  dVar90 = ABS(dVar90);
                  dVar87 = ABS(dVar86 - dVar1);
                  if (dVar87 + dVar87 <= dVar90) {
                    dVar85 = dVar1 * 3.0 - (dVar86 + dVar86);
                    dVar88 = dVar86;
                  }
                  else {
                    if (dVar90 + dVar90 <= dVar87) {
                      dVar86 = dVar1 * 3.0 -
                               ((double)CONCAT44(uVar81,uVar80) + (double)CONCAT44(uVar81,uVar80));
                    }
                    dVar85 = (double)CONCAT44(uVar81,uVar80);
                    dVar88 = dVar86;
                  }
                }
              }
            }
            dVar87 = dVar1 * 6.0 + (dVar88 + dVar85) * -3.0;
            dVar90 = ABS(dVar93) * (dt / geom.super_CoordSys.dx[0]);
            if (dVar93 <= 1e-08) {
              *(double *)((long)local_410 + lVar72 * 8 + lVar73) = dVar1;
              if (-1e-08 <= dVar93) goto LAB_00289caf;
              *(double *)((long)local_418 + lVar72 * 8 + lVar71) =
                   ((dVar90 * -0.6666666666666666 + 1.0) * dVar87 + (dVar85 - dVar88)) *
                   dVar90 * 0.5 + dVar88;
              dVar90 = *(double *)((long)local_270 + lVar72 * 8 + lVar79);
            }
            else {
              *(double *)((long)local_410 + lVar72 * 8 + lVar73) =
                   dVar90 * -0.5 *
                   ((dVar85 - dVar88) - (dVar90 * -0.6666666666666666 + 1.0) * dVar87) + dVar85;
LAB_00289caf:
              dVar90 = *(double *)((long)local_270 + lVar72 * 8 + lVar79);
              *(double *)((long)local_418 + lVar72 * 8 + lVar71) = dVar90;
            }
            dVar1 = *(double *)((long)local_260 + lVar72 * 8 + lVar66);
            dVar87 = *(double *)((long)local_270 + lVar72 * 8 + (iVar48 + -2) * lVar59);
            dVar85 = *(double *)
                      ((long)local_270 + lVar72 * 8 + (int)(~uVar4 + (int)lVar62) * lVar59);
            dVar86 = *(double *)
                      ((long)local_270 + lVar72 * 8 + (int)((int)(lVar62 + 1) - uVar4) * lVar59);
            dVar99 = *(double *)((long)local_270 + lVar72 * 8 + (iVar48 + 2) * lVar59);
            dVar89 = (dVar86 - dVar90) + (dVar86 - dVar90);
            dVar94 = (dVar90 - dVar85) + (dVar90 - dVar85);
            dVar96 = 0.0;
            dVar88 = ABS(dVar89);
            dVar92 = ABS(dVar94);
            dVar93 = 0.0;
            uVar43 = (ulong)DAT_00601290;
            if (1.0000000000000001e-20 < dVar94 * dVar89) {
              dVar95 = (dVar86 - dVar85) * 0.5;
              dVar97 = ABS(dVar95);
              dVar93 = dVar88;
              if (dVar92 <= dVar88) {
                dVar93 = dVar92;
              }
              if (dVar97 <= dVar93) {
                dVar93 = dVar97;
              }
              dVar93 = dVar93 * (double)((ulong)dVar95 & 0x8000000000000000 | uVar43);
            }
            dVar95 = (dVar85 - dVar87) + (dVar85 - dVar87);
            if (1.0000000000000001e-20 < dVar95 * dVar94) {
              dVar97 = (dVar90 - dVar87) * 0.5;
              dVar98 = ABS(dVar97);
              dVar95 = ABS(dVar95);
              dVar96 = ABS(dVar94);
              if (dVar95 <= ABS(dVar94)) {
                dVar96 = dVar95;
              }
              if (dVar98 <= dVar96) {
                dVar96 = dVar98;
              }
              dVar96 = dVar96 * (double)((ulong)dVar97 & 0x8000000000000000 | uVar43);
            }
            dVar97 = (dVar99 - dVar86) + (dVar99 - dVar86);
            dVar95 = 0.0;
            dVar98 = 0.0;
            if (1.0000000000000001e-20 < dVar89 * dVar97) {
              dVar98 = (dVar99 - dVar90) * 0.5;
              dVar91 = ABS(dVar98);
              dVar97 = ABS(dVar97);
              if (ABS(dVar89) <= dVar97) {
                dVar97 = ABS(dVar89);
              }
              if (dVar91 <= dVar97) {
                dVar97 = dVar91;
              }
              dVar98 = dVar97 * (double)((ulong)dVar98 & 0x8000000000000000 | uVar43);
            }
            if (1.0000000000000001e-20 < dVar94 * dVar89) {
              dVar89 = (dVar86 - dVar85) * 0.5;
              dVar94 = ABS(dVar89);
              if (dVar92 <= dVar88) {
                dVar88 = dVar92;
              }
              if (dVar94 <= dVar88) {
                dVar88 = dVar94;
              }
              dVar95 = dVar88 * (double)((ulong)dVar89 & 0x8000000000000000 | uVar43);
            }
            dVar92 = (dVar90 + dVar85) * 0.5 + (dVar93 - dVar96) * -0.16666666666666666;
            dVar88 = dVar85;
            if (dVar90 <= dVar85) {
              dVar88 = dVar90;
            }
            if (dVar88 <= dVar92) {
              dVar88 = dVar92;
            }
            uVar82 = (undefined4)((ulong)dVar85 >> 0x20);
            uVar81 = SUB84(dVar90,0);
            uVar84 = (undefined4)((ulong)dVar90 >> 0x20);
            uVar80 = SUB84(dVar85,0);
            uVar83 = uVar82;
            if (dVar85 <= dVar90) {
              uVar80 = uVar81;
              uVar83 = uVar84;
            }
            if (dVar88 <= (double)CONCAT44(uVar83,uVar80)) {
              uVar80 = SUB84(dVar88,0);
              uVar83 = (undefined4)((ulong)dVar88 >> 0x20);
            }
            dVar92 = (dVar90 + dVar86) * 0.5 + (dVar98 - dVar95) * -0.16666666666666666;
            dVar88 = dVar86;
            if (dVar90 <= dVar86) {
              dVar88 = dVar90;
            }
            if (dVar88 <= dVar92) {
              dVar88 = dVar92;
            }
            dVar92 = dVar86;
            if (dVar86 <= dVar90) {
              dVar92 = dVar90;
            }
            if (dVar88 <= dVar92) {
              dVar92 = dVar88;
            }
            dVar96 = dVar92 - dVar90;
            dVar88 = dVar90;
            dVar93 = dVar90;
            if (0.0 <= (dVar90 - (double)CONCAT44(uVar83,uVar80)) * dVar96) {
              dVar89 = ABS(dVar96);
              dVar94 = ABS((double)CONCAT44(uVar83,uVar80) - dVar90);
              if (dVar94 + dVar94 <= dVar89) {
                dVar93 = dVar90 * 3.0 -
                         ((double)CONCAT44(uVar83,uVar80) + (double)CONCAT44(uVar83,uVar80));
                dVar88 = (double)CONCAT44(uVar83,uVar80);
              }
              else {
                dVar88 = (double)CONCAT44(uVar83,uVar80);
                dVar93 = dVar92;
                if (dVar89 + dVar89 <= dVar94) {
                  dVar88 = dVar90 * 3.0 - (dVar92 + dVar92);
                }
              }
            }
            if (pBVar56->bc[1] - 3U < 2) {
              if (lVar62 == geom.domain.smallend.vect[1]) {
                dVar88 = dVar99 * -0.05 + dVar86 * 0.5 + dVar85 * -0.2 + dVar90 * 0.75;
                dVar99 = dVar90;
                if (dVar86 <= dVar90) {
                  dVar99 = dVar86;
                }
                if (dVar99 <= dVar88) {
                  dVar99 = dVar88;
                }
                dVar93 = dVar90;
                if (dVar90 <= dVar86) {
                  dVar93 = dVar86;
                }
                dVar88 = dVar85;
                if (dVar99 <= dVar93) {
                  dVar93 = dVar99;
                }
              }
              else if (lVar62 == (long)geom.domain.smallend.vect[1] + 1) {
                dVar99 = local_248[lVar72];
                dVar93 = local_250[lVar72] * -0.05 +
                         dVar90 * 0.5 + local_240[lVar72] * -0.2 + dVar99 * 0.75;
                dVar88 = dVar99;
                if (dVar90 <= dVar99) {
                  dVar88 = dVar90;
                }
                if (dVar88 <= dVar93) {
                  dVar88 = dVar93;
                }
                uVar80 = SUB84(dVar99,0);
                uVar83 = (int)((ulong)dVar99 >> 0x20);
                if (dVar99 <= dVar90) {
                  uVar80 = uVar81;
                  uVar83 = uVar84;
                }
                if (dVar88 <= (double)CONCAT44(uVar83,uVar80)) {
                  uVar80 = SUB84(dVar88,0);
                  uVar83 = (undefined4)((ulong)dVar88 >> 0x20);
                }
                dVar88 = dVar90;
                dVar93 = dVar90;
                if (0.0 < (dVar90 - (double)CONCAT44(uVar83,uVar80)) * dVar96) {
                  dVar96 = ABS(dVar96);
                  dVar99 = ABS((double)CONCAT44(uVar83,uVar80) - dVar90);
                  if (dVar99 + dVar99 <= dVar96) {
                    dVar88 = (double)CONCAT44(uVar83,uVar80);
                    dVar93 = dVar90 * 3.0 -
                             ((double)CONCAT44(uVar83,uVar80) + (double)CONCAT44(uVar83,uVar80));
                  }
                  else if (dVar96 + dVar96 <= dVar99) {
                    dVar88 = dVar90 * 3.0 - (dVar92 + dVar92);
                    dVar93 = dVar92;
                  }
                  else {
                    dVar88 = (double)CONCAT44(uVar83,uVar80);
                    dVar93 = dVar92;
                  }
                }
              }
            }
            if (pBVar56->bc[4] - 3U < 2) {
              if (lVar62 == geom.domain.bigend.vect[1]) {
                dVar87 = dVar87 * -0.05 + dVar85 * 0.5 + dVar86 * -0.2 + dVar90 * 0.75;
                if (dVar85 <= dVar90) {
                  uVar81 = SUB84(dVar85,0);
                  uVar84 = uVar82;
                }
                dVar99 = (double)CONCAT44(uVar84,uVar81);
                if ((double)CONCAT44(uVar84,uVar81) <= dVar87) {
                  dVar99 = dVar87;
                }
                dVar88 = dVar90;
                if (dVar90 <= dVar85) {
                  dVar88 = dVar85;
                }
                dVar93 = dVar86;
                if (dVar99 <= dVar88) {
                  dVar88 = dVar99;
                }
              }
              else if (lVar62 == (long)geom.domain.bigend.vect[1] + -1) {
                dVar87 = local_230[lVar72];
                dVar86 = local_238[lVar72] * -0.05 +
                         dVar90 * 0.5 + local_228[lVar72] * -0.2 + dVar87 * 0.75;
                dVar85 = dVar87;
                if (dVar90 <= dVar87) {
                  dVar85 = dVar90;
                }
                if (dVar85 <= dVar86) {
                  dVar85 = dVar86;
                }
                if (dVar87 <= dVar90) {
                  dVar87 = dVar90;
                }
                if (dVar85 <= dVar87) {
                  dVar87 = dVar85;
                }
                dVar88 = dVar90;
                dVar93 = dVar90;
                if (0.0 < (dVar90 - (double)CONCAT44(uVar83,uVar80)) * (dVar87 - dVar90)) {
                  dVar86 = ABS(dVar87 - dVar90);
                  dVar85 = ABS((double)CONCAT44(uVar83,uVar80) - dVar90);
                  if (dVar85 + dVar85 <= dVar86) {
                    dVar88 = (double)CONCAT44(uVar83,uVar80);
                    dVar93 = dVar90 * 3.0 -
                             ((double)CONCAT44(uVar83,uVar80) + (double)CONCAT44(uVar83,uVar80));
                  }
                  else {
                    dVar93 = dVar87;
                    if (dVar86 + dVar86 <= dVar85) {
                      dVar88 = dVar90 * 3.0 - (dVar87 + dVar87);
                    }
                    else {
                      dVar88 = (double)CONCAT44(uVar83,uVar80);
                    }
                  }
                }
              }
            }
            dVar85 = dVar90 * 6.0 + (dVar88 + dVar93) * -3.0;
            dVar87 = ABS(dVar1) * (dt / geom.super_CoordSys.dx[1]);
            if (dVar1 <= 1e-08) {
              *(double *)((long)local_400 + lVar72 * 8 + lVar77) = dVar90;
              if (-1e-08 <= dVar1) goto LAB_0028a45e;
              *(double *)((long)local_408 + lVar72 * 8 + lVar75) =
                   ((dVar87 * -0.6666666666666666 + 1.0) * dVar85 + (dVar93 - dVar88)) *
                   dVar87 * 0.5 + dVar88;
              dVar90 = *(double *)((long)local_270 + lVar72 * 8 + lVar79);
            }
            else {
              *(double *)((long)local_400 + lVar72 * 8 + lVar77) =
                   dVar87 * -0.5 *
                   ((dVar93 - dVar88) - (dVar87 * -0.6666666666666666 + 1.0) * dVar85) + dVar93;
LAB_0028a45e:
              dVar90 = *(double *)((long)local_270 + lVar72 * 8 + lVar79);
              *(double *)((long)local_408 + lVar72 * 8 + lVar75) = dVar90;
            }
            dVar1 = *(double *)((long)local_268 + lVar72 * 8 + lVar66);
            dVar87 = *(double *)((long)local_450 + lVar72 * 8 + lVar79 + iVar65 * lVar49);
            dVar85 = *(double *)((long)local_450 + lVar72 * 8 + lVar79 + iVar58 * lVar49);
            dVar86 = *(double *)((long)local_450 + lVar72 * 8 + lVar79 + iVar53 * lVar49);
            dVar99 = *(double *)((long)local_450 + lVar72 * 8 + lVar79 + iVar60 * lVar49);
            dVar89 = (dVar86 - dVar90) + (dVar86 - dVar90);
            dVar94 = (dVar90 - dVar85) + (dVar90 - dVar85);
            dVar93 = 0.0;
            dVar88 = ABS(dVar89);
            dVar96 = ABS(dVar94);
            dVar92 = 0.0;
            uVar43 = (ulong)DAT_00601290;
            if (1.0000000000000001e-20 < dVar94 * dVar89) {
              dVar95 = (dVar86 - dVar85) * 0.5;
              dVar97 = ABS(dVar95);
              dVar92 = dVar88;
              if (dVar96 <= dVar88) {
                dVar92 = dVar96;
              }
              if (dVar97 <= dVar92) {
                dVar92 = dVar97;
              }
              dVar92 = dVar92 * (double)((ulong)dVar95 & 0x8000000000000000 | uVar43);
            }
            dVar95 = (dVar85 - dVar87) + (dVar85 - dVar87);
            if (1.0000000000000001e-20 < dVar95 * dVar94) {
              dVar97 = (dVar90 - dVar87) * 0.5;
              dVar98 = ABS(dVar97);
              dVar95 = ABS(dVar95);
              dVar93 = ABS(dVar94);
              if (dVar95 <= ABS(dVar94)) {
                dVar93 = dVar95;
              }
              if (dVar98 <= dVar93) {
                dVar93 = dVar98;
              }
              dVar93 = dVar93 * (double)((ulong)dVar97 & 0x8000000000000000 | uVar43);
            }
            dVar95 = (dVar99 - dVar86) + (dVar99 - dVar86);
            dVar97 = 0.0;
            dVar98 = 0.0;
            if (1.0000000000000001e-20 < dVar89 * dVar95) {
              dVar98 = (dVar99 - dVar90) * 0.5;
              dVar91 = ABS(dVar98);
              dVar95 = ABS(dVar95);
              if (ABS(dVar89) <= dVar95) {
                dVar95 = ABS(dVar89);
              }
              if (dVar91 <= dVar95) {
                dVar95 = dVar91;
              }
              dVar98 = dVar95 * (double)((ulong)dVar98 & 0x8000000000000000 | uVar43);
            }
            if (1.0000000000000001e-20 < dVar94 * dVar89) {
              dVar89 = (dVar86 - dVar85) * 0.5;
              dVar94 = ABS(dVar89);
              if (dVar96 <= dVar88) {
                dVar88 = dVar96;
              }
              if (dVar94 <= dVar88) {
                dVar88 = dVar94;
              }
              dVar97 = dVar88 * (double)((ulong)dVar89 & 0x8000000000000000 | uVar43);
            }
            dVar92 = (dVar90 + dVar85) * 0.5 + (dVar92 - dVar93) * -0.16666666666666666;
            dVar88 = dVar85;
            if (dVar90 <= dVar85) {
              dVar88 = dVar90;
            }
            if (dVar88 <= dVar92) {
              dVar88 = dVar92;
            }
            dVar92 = dVar85;
            if (dVar85 <= dVar90) {
              dVar92 = dVar90;
            }
            if (dVar88 <= dVar92) {
              dVar92 = dVar88;
            }
            dVar93 = (dVar90 + dVar86) * 0.5 + (dVar98 - dVar97) * -0.16666666666666666;
            dVar88 = dVar86;
            if (dVar90 <= dVar86) {
              dVar88 = dVar90;
            }
            if (dVar88 <= dVar93) {
              dVar88 = dVar93;
            }
            dVar93 = dVar86;
            if (dVar86 <= dVar90) {
              dVar93 = dVar90;
            }
            if (dVar88 <= dVar93) {
              dVar93 = dVar88;
            }
            dVar89 = dVar93 - dVar90;
            dVar88 = dVar90;
            dVar96 = dVar90;
            if (0.0 <= (dVar90 - dVar92) * dVar89) {
              dVar94 = ABS(dVar89);
              dVar95 = ABS(dVar92 - dVar90);
              dVar88 = dVar92;
              if (dVar95 + dVar95 <= dVar94) {
                dVar96 = dVar90 * 3.0 - (dVar92 + dVar92);
              }
              else {
                dVar96 = dVar93;
                if (dVar94 + dVar94 <= dVar95) {
                  dVar88 = dVar90 * 3.0 - (dVar93 + dVar93);
                }
              }
            }
            if (pBVar56->bc[2] - 3U < 2) {
              if (lVar70 == geom.domain.smallend.vect[2]) {
                dVar88 = dVar99 * -0.05 + dVar86 * 0.5 + dVar85 * -0.2 + dVar90 * 0.75;
                dVar99 = dVar90;
                if (dVar86 <= dVar90) {
                  dVar99 = dVar86;
                }
                if (dVar99 <= dVar88) {
                  dVar99 = dVar88;
                }
                dVar96 = dVar90;
                if (dVar90 <= dVar86) {
                  dVar96 = dVar86;
                }
                dVar88 = dVar85;
                if (dVar99 <= dVar96) {
                  dVar96 = dVar99;
                }
              }
              else if (lVar70 == (long)geom.domain.smallend.vect[2] + 1) {
                dVar92 = *(double *)((long)local_428 + lVar72 * 8 + lVar79);
                dVar88 = *(double *)((long)local_420 + lVar72 * 8 + lVar79) * -0.05 +
                         dVar90 * 0.5 +
                         *(double *)((long)local_430 + lVar72 * 8 + lVar79) * -0.2 + dVar92 * 0.75;
                dVar99 = dVar92;
                if (dVar90 <= dVar92) {
                  dVar99 = dVar90;
                }
                if (dVar99 <= dVar88) {
                  dVar99 = dVar88;
                }
                if (dVar92 <= dVar90) {
                  dVar92 = dVar90;
                }
                if (dVar99 <= dVar92) {
                  dVar92 = dVar99;
                }
                dVar88 = dVar90;
                dVar96 = dVar90;
                if (0.0 < (dVar90 - dVar92) * dVar89) {
                  dVar89 = ABS(dVar89);
                  dVar99 = ABS(dVar92 - dVar90);
                  dVar88 = dVar92;
                  if (dVar99 + dVar99 <= dVar89) {
                    dVar96 = dVar90 * 3.0 - (dVar92 + dVar92);
                  }
                  else {
                    dVar96 = dVar93;
                    if (dVar89 + dVar89 <= dVar99) {
                      dVar88 = dVar90 * 3.0 - (dVar93 + dVar93);
                    }
                  }
                }
              }
            }
            if (pBVar56->bc[5] - 3U < 2) {
              if (lVar70 == geom.domain.bigend.vect[2]) {
                dVar99 = dVar87 * -0.05 + dVar85 * 0.5 + dVar86 * -0.2 + dVar90 * 0.75;
                dVar87 = dVar90;
                if (dVar85 <= dVar90) {
                  dVar87 = dVar85;
                }
                if (dVar87 <= dVar99) {
                  dVar87 = dVar99;
                }
                dVar88 = dVar90;
                if (dVar90 <= dVar85) {
                  dVar88 = dVar85;
                }
                dVar96 = dVar86;
                if (dVar87 <= dVar88) {
                  dVar88 = dVar87;
                }
              }
              else if (lVar70 == (long)geom.domain.bigend.vect[2] + -1) {
                dVar87 = *(double *)((long)local_440 + lVar72 * 8 + lVar79);
                uVar80 = SUB84(dVar87,0);
                uVar81 = (undefined4)((ulong)dVar87 >> 0x20);
                dVar86 = *(double *)((long)local_438 + lVar72 * 8 + lVar79) * -0.05 +
                         dVar90 * 0.5 +
                         *(double *)((long)local_448 + lVar72 * 8 + lVar79) * -0.2 + dVar87 * 0.75;
                dVar85 = dVar87;
                if (dVar90 <= dVar87) {
                  dVar85 = dVar90;
                }
                if (dVar85 <= dVar86) {
                  dVar85 = dVar86;
                }
                if (dVar87 <= dVar90) {
                  uVar80 = SUB84(dVar90,0);
                  uVar81 = (undefined4)((ulong)dVar90 >> 0x20);
                }
                if (dVar85 <= (double)CONCAT44(uVar81,uVar80)) {
                  uVar80 = SUB84(dVar85,0);
                  uVar81 = (undefined4)((ulong)dVar85 >> 0x20);
                }
                dVar87 = (double)CONCAT44(uVar81,uVar80) - dVar90;
                dVar88 = dVar90;
                dVar96 = dVar90;
                if (0.0 < (dVar90 - dVar92) * dVar87) {
                  dVar87 = ABS(dVar87);
                  dVar85 = ABS(dVar92 - dVar90);
                  if (dVar85 + dVar85 <= dVar87) {
                    dVar88 = dVar92;
                    dVar96 = dVar90 * 3.0 - (dVar92 + dVar92);
                  }
                  else {
                    if (dVar87 + dVar87 <= dVar85) {
                      dVar92 = dVar90 * 3.0 -
                               ((double)CONCAT44(uVar81,uVar80) + (double)CONCAT44(uVar81,uVar80));
                    }
                    dVar88 = dVar92;
                    dVar96 = (double)CONCAT44(uVar81,uVar80);
                  }
                }
              }
            }
            dVar85 = dVar90 * 6.0 + (dVar88 + dVar96) * -3.0;
            dVar87 = ABS(dVar1) * (dt / geom.super_CoordSys.dx[2]);
            if (dVar1 <= 1e-08) {
              *(double *)((long)local_3f8 + lVar72 * 8 + lVar63) = dVar90;
              if (-1e-08 <= dVar1) goto LAB_0028abf2;
              dVar88 = ((dVar87 * -0.6666666666666666 + 1.0) * dVar85 + (dVar96 - dVar88)) *
                       dVar87 * 0.5 + dVar88;
            }
            else {
              *(double *)((long)local_3f8 + lVar72 * 8 + lVar63) =
                   dVar87 * -0.5 *
                   ((dVar96 - dVar88) - (dVar87 * -0.6666666666666666 + 1.0) * dVar85) + dVar96;
LAB_0028abf2:
              dVar88 = *(double *)((long)local_270 + lVar72 * 8 + lVar79);
            }
            *(double *)((long)local_3f0 + lVar72 * 8 + (lVar62 - iVar11) * lVar39 * 8) = dVar88;
            lVar72 = lVar72 + 1;
            lVar44 = lVar62 + 1;
          } while ((iVar14 - iVar2) + 1 != (int)lVar72);
        }
      }
      local_418 = local_418 + lVar17;
      local_410 = local_410 + lVar18;
      local_408 = local_408 + lVar19;
      local_400 = local_400 + lVar20;
      local_3f8 = local_3f8 + lVar21;
      local_3f0 = local_3f0 + lVar22;
      local_250 = local_250 + lVar23;
      local_248 = local_248 + lVar23;
      local_240 = local_240 + lVar23;
      local_238 = local_238 + lVar23;
      local_230 = local_230 + lVar23;
      local_228 = local_228 + lVar23;
      local_270 = local_270 + lVar23;
      iVar60 = iVar60 + 1;
      iVar58 = iVar58 + 1;
      iVar65 = iVar65 + 1;
      local_268 = local_268 + lVar25;
      local_260 = local_260 + lVar25;
      local_258 = local_258 + lVar25;
      lVar70 = lVar70 + 1;
    }
    lVar57 = lVar57 + 1;
    pdVar61 = pdVar61 + lVar32;
    pdVar64 = pdVar64 + lVar34;
    pdVar69 = pdVar69 + lVar36;
    pdVar76 = pdVar76 + lVar38;
    pdVar74 = pdVar74 + lVar42;
    local_4b8 = local_4b8 + lVar40;
    local_480 = local_480 + lVar30;
    local_488 = local_488 + lVar30;
    local_490 = local_490 + lVar30;
    local_498 = local_498 + lVar30;
    local_4a0 = local_4a0 + lVar30;
    local_4a8 = local_4a8 + lVar30;
    local_308 = local_308 + lVar30;
    local_420 = local_420 + lVar30;
    local_428 = local_428 + lVar30;
    local_430 = local_430 + lVar30;
    local_438 = local_438 + lVar30;
    local_440 = local_440 + lVar30;
    local_448 = local_448 + lVar30;
    local_450 = local_450 + lVar30;
  } while( true );
}

Assistant:

void
PPM::PredictVelOnFaces (Box const& bx,
                        AMREX_D_DECL( Array4<Real> const& Imx,
                                      Array4<Real> const& Imy,
                                      Array4<Real> const& Imz),
                        AMREX_D_DECL( Array4<Real> const& Ipx,
                                      Array4<Real> const& Ipy,
                                      Array4<Real> const& Ipz),
                        Array4<Real const> const& q,
                        Array4<Real const> const& vel,
                        Geometry geom,
                        Real dt,
                        BCRec const* pbc)
{
    const Box& domain = geom.Domain();
    const Dim3 dlo = amrex::lbound(domain);
    const Dim3 dhi = amrex::ubound(domain);

    const auto dx = geom.CellSizeArray();
    AMREX_D_TERM( Real l_dtdx = dt / dx[0];,
                  Real l_dtdy = dt / dx[1];,
                  Real l_dtdz = dt / dx[2];);

    amrex::ParallelFor(bx, AMREX_SPACEDIM,
    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        PredictVelOnXFace(i,j,k,n,l_dtdx,vel(i,j,k,0),q,Imx,Ipx,pbc[n],dlo.x,dhi.x);
        PredictVelOnYFace(i,j,k,n,l_dtdy,vel(i,j,k,1),q,Imy,Ipy,pbc[n],dlo.y,dhi.y);
#if (AMREX_SPACEDIM==3)
        PredictVelOnZFace(i,j,k,n,l_dtdz,vel(i,j,k,2),q,Imz,Ipz,pbc[n],dlo.z,dhi.z);
#endif
    });
}